

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O0

iterator * __thiscall HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(iterator *this)

{
  iterator *this_local;
  
  (this->pos_).index_ = (this->pos_).index_ + -(long)this->currentNode;
  (this->pos_).value_ = (this->pos_).value_ + -(long)this->currentNode;
  this->currentNode = this->nodeNext[this->currentNode];
  (this->pos_).index_ = (this->pos_).index_ + this->currentNode;
  (this->pos_).value_ = (this->pos_).value_ + this->currentNode;
  return this;
}

Assistant:

iterator& operator++() {
      pos_.index_ -= currentNode;
      pos_.value_ -= currentNode;
      currentNode = nodeNext[currentNode];
      pos_.index_ += currentNode;
      pos_.value_ += currentNode;
      return *this;
    }